

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> __thiscall
CompoundFile::File::stream(File *this,Directory *dir)

{
  _Head_base<0UL,_Excel::Stream_*,_false> in_RDI;
  Directory *unaff_retaddr;
  SAT *in_stack_00000008;
  SAT *in_stack_00000010;
  Header *in_stack_00000018;
  basic_istream<char,_std::char_traits<char>_> *in_stack_00000030;
  _Head_base<0UL,_Excel::Stream_*,_false> __u;
  unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> *in_stack_ffffffffffffffe0;
  
  __u._M_head_impl = in_RDI._M_head_impl;
  std::
  make_unique<CompoundFile::Stream,CompoundFile::Header&,CompoundFile::SAT&,CompoundFile::SAT&,CompoundFile::Directory_const&,CompoundFile::SecID&,std::istream&>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (SecID *)in_RDI._M_head_impl,in_stack_00000030);
  std::unique_ptr<Excel::Stream,std::default_delete<Excel::Stream>>::
  unique_ptr<CompoundFile::Stream,std::default_delete<CompoundFile::Stream>,void>
            (in_stack_ffffffffffffffe0,
             (unique_ptr<CompoundFile::Stream,_std::default_delete<CompoundFile::Stream>_> *)
             __u._M_head_impl);
  std::unique_ptr<CompoundFile::Stream,_std::default_delete<CompoundFile::Stream>_>::~unique_ptr
            ((unique_ptr<CompoundFile::Stream,_std::default_delete<CompoundFile::Stream>_> *)
             in_RDI._M_head_impl);
  return (__uniq_ptr_data<Excel::Stream,_std::default_delete<Excel::Stream>,_true,_true>)
         (tuple<Excel::Stream_*,_std::default_delete<Excel::Stream>_>)__u._M_head_impl;
}

Assistant:

inline std::unique_ptr< Excel::Stream >
File::stream( const Directory & dir )
{
	return std::make_unique< CompoundFile::Stream > ( m_header,
		m_sat, m_ssat, dir, m_shortStreamFirstSector, m_stream );
}